

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  MessageFactory **this_00;
  CodedInputStream **this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *other;
  ParseFlags extraout_EDX;
  ParseFlags extraout_EDX_00;
  ParseFlags PVar3;
  MessageFactory local_f8;
  ZeroCopyCodedInputStream zcis;
  ParseContext ctx;
  CodedInputStream *local_40;
  char *ptr;
  
  ctx.data_.factory = &local_f8;
  local_f8._vptr_MessageFactory = (_func_int **)&PTR__ZeroCopyInputStream_003df218;
  this_01 = &zcis.cis_;
  zcis.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = (_func_int **)input;
  internal::ParseContext::ParseContext<google::protobuf::ZeroCopyCodedInputStream*>
            ((ParseContext *)this_01,input->recursion_budget_,input->aliasing_enabled_,
             (char **)&local_40,(ZeroCopyCodedInputStream **)&ctx.data_.factory);
  ctx.super_EpsCopyInputStream.overall_limit_ = 0;
  ctx.depth_ = *(int *)&input->extension_pool_;
  ctx.group_depth_ = *(int *)((long)&input->extension_pool_ + 4);
  ctx.data_.pool._0_4_ = *(undefined4 *)&input->extension_factory_;
  ctx.data_.pool._4_4_ = *(undefined4 *)((long)&input->extension_factory_ + 4);
  iVar2 = (*this->_vptr_MessageLite[0xb])(this,local_40,this_01);
  local_40 = (CodedInputStream *)CONCAT44(extraout_var,iVar2);
  if (local_40 == (CodedInputStream *)0x0) {
LAB_0027fd79:
    bVar1 = false;
  }
  else {
    internal::EpsCopyInputStream::BackUp((EpsCopyInputStream *)this_01,(char *)local_40);
    PVar3 = extraout_EDX;
    if ((int)ctx.super_EpsCopyInputStream.aliasing_ == 1) {
      input->legitimate_message_end_ = true;
    }
    else {
      if ((int)ctx.super_EpsCopyInputStream.aliasing_ == 0) {
        this_00 = &ctx.data_.factory;
        internal::LogMessage::LogMessage
                  ((LogMessage *)this_00,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/message_lite.cc"
                   ,0xf0);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)this_00,"CHECK failed: ctx.LastTag() != 1: ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&ptr + 7),other);
        internal::LogMessage::~LogMessage((LogMessage *)&ctx.data_.factory);
        PVar3 = extraout_EDX_00;
      }
      if ((zcis.cis_ < local_40) &&
         ((ctx.super_EpsCopyInputStream.buffer_end_ == (char *)0x0 ||
          ((long)ctx.super_EpsCopyInputStream.next_chunk_._4_4_ <
           (long)local_40 - (long)ctx.super_EpsCopyInputStream.limit_end_)))) goto LAB_0027fd79;
      input->last_tag_ = (int)ctx.super_EpsCopyInputStream.aliasing_ + 1;
    }
    bVar1 = anon_unknown_17::CheckFieldPresence
                      ((ParseContext *)this,(MessageLite *)(ulong)parse_flags,PVar3);
  }
  return bVar1;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}